

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O0

int nghttp2_hd_huff_encode(nghttp2_bufs *bufs,uint8_t *src,size_t srclen)

{
  byte b;
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  ulong uStack_58;
  int rv;
  size_t avail;
  size_t nbits;
  ulong uStack_40;
  uint32_t x;
  uint64_t code;
  uint8_t *end;
  nghttp2_huff_sym *sym;
  size_t srclen_local;
  uint8_t *src_local;
  nghttp2_bufs *bufs_local;
  
  uStack_40 = 0;
  avail = 0;
  uStack_58 = (long)(bufs->cur->buf).end - (long)(bufs->cur->buf).last;
  srclen_local = (size_t)src;
  while ((uint8_t *)srclen_local != src + srclen) {
    sVar3 = srclen_local + 1;
    uStack_40 = (ulong)huff_sym_table[*(byte *)srclen_local].code << (0x20U - (char)avail & 0x3f) |
                uStack_40;
    avail = huff_sym_table[*(byte *)srclen_local].nbits + avail;
    srclen_local = sVar3;
    if (0x1f < avail) {
      if (uStack_58 < 4) {
        for (; 7 < avail; avail = avail - 8) {
          iVar2 = nghttp2_bufs_addb(bufs,(uint8_t)(uStack_40 >> 0x38));
          if (iVar2 != 0) {
            return iVar2;
          }
          uStack_40 = uStack_40 << 8;
        }
        uStack_58 = (long)(bufs->cur->buf).end - (long)(bufs->cur->buf).last;
      }
      else {
        uVar1 = htonl((uint32_t)(uStack_40 >> 0x20));
        *(uint32_t *)(bufs->cur->buf).last = uVar1;
        (bufs->cur->buf).last = (bufs->cur->buf).last + 4;
        uStack_58 = uStack_58 - 4;
        uStack_40 = uStack_40 << 0x20;
        avail = avail - 0x20;
      }
    }
  }
  while( true ) {
    b = (byte)(uStack_40 >> 0x38);
    if (avail < 8) {
      if ((avail == 0) ||
         (bufs_local._4_4_ = nghttp2_bufs_addb(bufs,b | (char)(1 << (8U - (char)avail & 0x1f)) - 1U)
         , bufs_local._4_4_ == 0)) {
        bufs_local._4_4_ = 0;
      }
      return bufs_local._4_4_;
    }
    iVar2 = nghttp2_bufs_addb(bufs,b);
    if (iVar2 != 0) break;
    uStack_40 = uStack_40 << 8;
    avail = avail - 8;
  }
  return iVar2;
}

Assistant:

int nghttp2_hd_huff_encode(nghttp2_bufs *bufs, const uint8_t *src,
                           size_t srclen) {
  const nghttp2_huff_sym *sym;
  const uint8_t *end = src + srclen;
  uint64_t code = 0;
  uint32_t x;
  size_t nbits = 0;
  size_t avail;
  int rv;

  avail = nghttp2_bufs_cur_avail(bufs);

  for (; src != end;) {
    sym = &huff_sym_table[*src++];
    code |= (uint64_t)sym->code << (32 - nbits);
    nbits += sym->nbits;
    if (nbits < 32) {
      continue;
    }
    if (avail >= 4) {
      x = htonl((uint32_t)(code >> 32));
      memcpy(bufs->cur->buf.last, &x, 4);
      bufs->cur->buf.last += 4;
      avail -= 4;
      code <<= 32;
      nbits -= 32;
      continue;
    }

    for (; nbits >= 8;) {
      rv = nghttp2_bufs_addb(bufs, (uint8_t)(code >> 56));
      if (rv != 0) {
        return rv;
      }
      code <<= 8;
      nbits -= 8;
    }

    avail = nghttp2_bufs_cur_avail(bufs);
  }

  for (; nbits >= 8;) {
    rv = nghttp2_bufs_addb(bufs, (uint8_t)(code >> 56));
    if (rv != 0) {
      return rv;
    }
    code <<= 8;
    nbits -= 8;
  }

  if (nbits) {
    rv = nghttp2_bufs_addb(
        bufs, (uint8_t)((uint8_t)(code >> 56) | ((1 << (8 - nbits)) - 1)));
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}